

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::ConvertSchnorrPubkey(ByteData256 *__return_storage_ptr__,secp256k1_xonly_pubkey *pubkey)

{
  pointer ctx_00;
  uchar *output32;
  CfdException *this;
  allocator local_71;
  string local_70;
  int local_50;
  int ret;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_bytes;
  secp256k1_context_struct *ctx;
  secp256k1_xonly_pubkey *pubkey_local;
  
  result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator(&local_39);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x20,&local_39);
  ::std::allocator<unsigned_char>::~allocator(&local_39);
  ctx_00 = result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  output32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  local_50 = secp256k1_xonly_pubkey_serialize((secp256k1_context *)ctx_00,output32,pubkey);
  if (local_50 != 1) {
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"Secp256k1 serialize exception",&local_71);
    CfdException::CfdException(this,kCfdInternalError,&local_70);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConvertSchnorrPubkey(const secp256k1_xonly_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(SchnorrPubkey::kSchnorrPubkeySize);
  int ret =
      secp256k1_xonly_pubkey_serialize(ctx, result_bytes.data(), &pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return ByteData256(result_bytes);
}